

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * dmrC_evaluate_expression(dmr_C *C,expression *expr)

{
  symbol *psVar1;
  expression *expr_local;
  dmr_C *C_local;
  
  if (expr == (expression *)0x0) {
    C_local = (dmr_C *)0x0;
  }
  else if (expr->ctype == (symbol *)0x0) {
    switch(*(undefined1 *)expr) {
    case 1:
    case 0x1c:
      dmrC_expression_error(C,expr,"value expression without a type");
      C_local = (dmr_C *)0x0;
      break;
    case 2:
      C_local = (dmr_C *)evaluate_string(C,expr);
      break;
    case 3:
      C_local = (dmr_C *)evaluate_symbol_expression(C,expr);
      break;
    case 4:
      evaluate_symbol(C,(expr->field_5).field_4.symbol);
      expr->ctype = &C->S->type_ctype;
      C_local = (dmr_C *)&C->S->type_ctype;
      break;
    case 5:
      psVar1 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
      if (psVar1 == (symbol *)0x0) {
        C_local = (dmr_C *)0x0;
      }
      else {
        psVar1 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right);
        if (psVar1 == (symbol *)0x0) {
          C_local = (dmr_C *)0x0;
        }
        else {
          C_local = (dmr_C *)evaluate_binop(C,expr);
        }
      }
      break;
    case 6:
      psVar1 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
      if (psVar1 == (symbol *)0x0) {
        C_local = (dmr_C *)0x0;
      }
      else {
        psVar1 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right);
        if (psVar1 == (symbol *)0x0) {
          C_local = (dmr_C *)0x0;
        }
        else {
          C_local = (dmr_C *)evaluate_assignment(C,expr);
        }
      }
      break;
    case 7:
      C_local = (dmr_C *)evaluate_logical(C,expr);
      break;
    case 8:
      C_local = (dmr_C *)evaluate_member_dereference(C,expr);
      break;
    case 9:
      psVar1 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
      if (psVar1 == (symbol *)0x0) {
        C_local = (dmr_C *)0x0;
      }
      else {
        C_local = (dmr_C *)evaluate_preop(C,expr);
      }
      break;
    case 10:
      psVar1 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
      if (psVar1 == (symbol *)0x0) {
        C_local = (dmr_C *)0x0;
      }
      else {
        C_local = (dmr_C *)evaluate_postop(C,expr);
      }
      break;
    case 0xb:
    case 0xc:
    case 0xd:
      C_local = (dmr_C *)evaluate_cast(C,expr);
      break;
    case 0xe:
      C_local = (dmr_C *)evaluate_sizeof(C,expr);
      break;
    case 0xf:
      C_local = (dmr_C *)evaluate_alignof(C,expr);
      break;
    case 0x10:
      C_local = (dmr_C *)evaluate_ptrsizeof(C,expr);
      break;
    case 0x11:
    case 0x12:
      C_local = (dmr_C *)evaluate_conditional_expression(C,expr);
      break;
    case 0x13:
      psVar1 = dmrC_evaluate_statement(C,(expr->field_5).statement);
      expr->ctype = psVar1;
      C_local = (dmr_C *)expr->ctype;
      break;
    case 0x14:
      C_local = (dmr_C *)evaluate_call(C,expr);
      break;
    case 0x15:
      dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
      psVar1 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right);
      if (psVar1 == (symbol *)0x0) {
        C_local = (dmr_C *)0x0;
      }
      else {
        C_local = (dmr_C *)evaluate_comma(C,expr);
      }
      break;
    case 0x16:
      psVar1 = dmrC_evaluate_expression(C,(expr->field_5).field_3.unop);
      if (psVar1 == (symbol *)0x0) {
        C_local = (dmr_C *)0x0;
      }
      else {
        psVar1 = dmrC_evaluate_expression(C,(expr->field_5).field_6.right);
        if (psVar1 == (symbol *)0x0) {
          C_local = (dmr_C *)0x0;
        }
        else {
          C_local = (dmr_C *)evaluate_compare(C,expr);
        }
      }
      break;
    case 0x17:
      expr->ctype = &C->S->ptr_ctype;
      C_local = (dmr_C *)&C->S->ptr_ctype;
      break;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      dmrC_expression_error(C,expr,"internal front-end error: initializer in expression");
      C_local = (dmr_C *)0x0;
      break;
    case 0x1d:
      dmrC_expression_error(C,expr,"internal front-end error: SLICE re-evaluated");
      C_local = (dmr_C *)0x0;
      break;
    case 0x1e:
      C_local = (dmr_C *)evaluate_offsetof(C,expr);
      break;
    default:
      C_local = (dmr_C *)0x0;
    }
  }
  else {
    C_local = (dmr_C *)expr->ctype;
  }
  return (symbol *)C_local;
}

Assistant:

struct symbol *dmrC_evaluate_expression(struct dmr_C *C, struct expression *expr)
{
	if (!expr)
		return NULL;
	if (expr->ctype)
		return expr->ctype;

	switch (expr->type) {
	case EXPR_VALUE:
	case EXPR_FVALUE:
		dmrC_expression_error(C, expr, "value expression without a type");
		return NULL;
	case EXPR_STRING:
		return evaluate_string(C, expr);
	case EXPR_SYMBOL:
		return evaluate_symbol_expression(C, expr);
	case EXPR_BINOP:
		if (!dmrC_evaluate_expression(C, expr->left))
			return NULL;
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_binop(C, expr);
	case EXPR_LOGICAL:
		return evaluate_logical(C, expr);
	case EXPR_COMMA:
		dmrC_evaluate_expression(C, expr->left);
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_comma(C, expr);
	case EXPR_COMPARE:
		if (!dmrC_evaluate_expression(C, expr->left))
			return NULL;
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_compare(C, expr);
	case EXPR_ASSIGNMENT:
		if (!dmrC_evaluate_expression(C, expr->left))
			return NULL;
		if (!dmrC_evaluate_expression(C, expr->right))
			return NULL;
		return evaluate_assignment(C, expr);
	case EXPR_PREOP:
		if (!dmrC_evaluate_expression(C, expr->unop))
			return NULL;
		return evaluate_preop(C, expr);
	case EXPR_POSTOP:
		if (!dmrC_evaluate_expression(C, expr->unop))
			return NULL;
		return evaluate_postop(C, expr);
	case EXPR_CAST:
	case EXPR_FORCE_CAST:
	case EXPR_IMPLIED_CAST:
		return evaluate_cast(C, expr);
	case EXPR_SIZEOF:
		return evaluate_sizeof(C, expr);
	case EXPR_PTRSIZEOF:
		return evaluate_ptrsizeof(C, expr);
	case EXPR_ALIGNOF:
		return evaluate_alignof(C, expr);
	case EXPR_DEREF:
		return evaluate_member_dereference(C, expr);
	case EXPR_CALL:
		return evaluate_call(C, expr);
	case EXPR_SELECT:
	case EXPR_CONDITIONAL:
		return evaluate_conditional_expression(C, expr);
	case EXPR_STATEMENT:
		expr->ctype = dmrC_evaluate_statement(C, expr->statement);
		return expr->ctype;

	case EXPR_LABEL:
		expr->ctype = &C->S->ptr_ctype;
		return &C->S->ptr_ctype;

	case EXPR_TYPE:
		/* Evaluate the type of the symbol .. */
		evaluate_symbol(C, expr->symbol);
		/* .. but the type of the _expression_ is a "type" */
		expr->ctype = &C->S->type_ctype;
		return &C->S->type_ctype;

	case EXPR_OFFSETOF:
		return evaluate_offsetof(C, expr);

	/* These can not exist as stand-alone expressions */
	case EXPR_INITIALIZER:
	case EXPR_IDENTIFIER:
	case EXPR_INDEX:
	case EXPR_POS:
		dmrC_expression_error(C, expr, "internal front-end error: initializer in expression");
		return NULL;
	case EXPR_SLICE:
		dmrC_expression_error(C, expr, "internal front-end error: SLICE re-evaluated");
		return NULL;
	}
	return NULL;
}